

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memtable.cc
# Opt level: O0

void __thiscall leveldb::MemTable::MemTable(MemTable *this,InternalKeyComparator *comparator)

{
  SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *in_RSI;
  Arena *in_RDI;
  InternalKeyComparator *in_stack_ffffffffffffffc8;
  Arena *in_stack_ffffffffffffffe0;
  KeyComparator *in_stack_ffffffffffffffe8;
  
  KeyComparator::KeyComparator((KeyComparator *)in_RDI,in_stack_ffffffffffffffc8);
  *(undefined4 *)
   &(in_RDI->blocks_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
    super__Vector_impl_data._M_start = 0;
  Arena::Arena(in_RDI);
  KeyComparator::KeyComparator((KeyComparator *)in_RDI,(KeyComparator *)in_stack_ffffffffffffffc8);
  SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::SkipList
            (in_RSI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  KeyComparator::~KeyComparator((KeyComparator *)0x122094);
  return;
}

Assistant:

MemTable::MemTable(const InternalKeyComparator& comparator)
    : comparator_(comparator), refs_(0), table_(comparator_, &arena_) {}